

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timsort.h
# Opt level: O0

void libxml_domnode_tim_sort_merge
               (xmlNodePtr *dst,TIM_SORT_RUN_T *stack,int stack_curr,TEMP_STORAGE_T *store)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  xmlNodePtr *__dest;
  int iVar4;
  size_t local_70;
  ulong local_60;
  size_t k;
  size_t j;
  size_t i;
  xmlNodePtr *storage;
  size_t curr;
  size_t B;
  size_t A;
  TEMP_STORAGE_T *store_local;
  int stack_curr_local;
  TIM_SORT_RUN_T *stack_local;
  xmlNodePtr *dst_local;
  
  uVar1 = stack[stack_curr + -2].length;
  uVar2 = stack[stack_curr + -1].length;
  uVar3 = stack[stack_curr + -2].start;
  local_70 = uVar2;
  if (uVar1 < uVar2) {
    local_70 = uVar1;
  }
  libxml_domnode_tim_sort_resize(store,local_70);
  __dest = store->storage;
  if (uVar1 < uVar2) {
    memcpy(__dest,dst + uVar3,uVar1 << 3);
    j = 0;
    k = uVar3 + uVar1;
    for (local_60 = uVar3; local_60 < uVar3 + uVar1 + uVar2; local_60 = local_60 + 1) {
      if ((j < uVar1) && (k < uVar3 + uVar1 + uVar2)) {
        iVar4 = wrap_cmp(__dest[j],dst[k]);
        if (iVar4 < 1) {
          dst[local_60] = __dest[j];
          j = j + 1;
        }
        else {
          dst[local_60] = dst[k];
          k = k + 1;
        }
      }
      else {
        if (uVar1 <= j) {
          return;
        }
        dst[local_60] = __dest[j];
        j = j + 1;
      }
    }
  }
  else {
    memcpy(__dest,dst + uVar3 + uVar1,uVar2 << 3);
    local_60 = uVar3 + uVar1 + uVar2;
    k = uVar3 + uVar1;
    j = uVar2;
    while (uVar3 < local_60) {
      local_60 = local_60 - 1;
      if ((j == 0) || (k <= uVar3)) {
        if (j == 0) {
          return;
        }
        dst[local_60] = __dest[j - 1];
        j = j - 1;
      }
      else {
        iVar4 = wrap_cmp(dst[k - 1],__dest[j - 1]);
        if (iVar4 < 1) {
          dst[local_60] = __dest[j - 1];
          j = j - 1;
        }
        else {
          dst[local_60] = dst[k - 1];
          k = k - 1;
        }
      }
    }
  }
  return;
}

Assistant:

static void TIM_SORT_MERGE(SORT_TYPE *dst, const TIM_SORT_RUN_T *stack, const int stack_curr,
                           TEMP_STORAGE_T *store) {
  const size_t A = stack[stack_curr - 2].length;
  const size_t B = stack[stack_curr - 1].length;
  const size_t curr = stack[stack_curr - 2].start;
  SORT_TYPE *storage;
  size_t i, j, k;
  TIM_SORT_RESIZE(store, MIN(A, B));
  storage = store->storage;

  /* left merge */
  if (A < B) {
    memcpy(storage, &dst[curr], A * sizeof(SORT_TYPE));
    i = 0;
    j = curr + A;

    for (k = curr; k < curr + A + B; k++) {
      if ((i < A) && (j < curr + A + B)) {
        if (SORT_CMP(storage[i], dst[j]) <= 0) {
          dst[k] = storage[i++];
        } else {
          dst[k] = dst[j++];
        }
      } else if (i < A) {
        dst[k] = storage[i++];
      } else {
        break;
      }
    }
  } else {
    /* right merge */
    memcpy(storage, &dst[curr + A], B * sizeof(SORT_TYPE));
    i = B;
    j = curr + A;
    k = curr + A + B;

    while (k > curr) {
      k--;
      if ((i > 0) && (j > curr)) {
        if (SORT_CMP(dst[j - 1], storage[i - 1]) > 0) {
          dst[k] = dst[--j];
        } else {
          dst[k] = storage[--i];
        }
      } else if (i > 0) {
        dst[k] = storage[--i];
      } else {
        break;
      }
    }
  }
}